

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
deqp::gls::BuiltinPrecisionTests::
TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Distance>::createCase
          (MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
          TemplateFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Distance> *this,
          Context *ctx)

{
  char *name;
  TestNode *this_00;
  Distance<1> *func;
  PrecisionCase *pPVar1;
  Distance<2> *func_00;
  Distance<3> *func_01;
  Distance<4> *func_02;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (TestNode *)operator_new(0x70);
  name = (ctx->name)._M_dataplus._M_p;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,ctx->testContext,name,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"scalar",&local_39);
  func = instance<deqp::gls::BuiltinPrecisionTests::Functions::Distance<1>>();
  pPVar1 = createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<float,float,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                     (ctx,&local_38,
                      (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                       *)func);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vec2",&local_39);
  func_00 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Distance<2>>();
  pPVar1 = createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<float,tcu::Vector<float,2>,tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                     (ctx,&local_38,
                      (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                       *)func_00);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vec3",&local_39);
  func_01 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Distance<3>>();
  pPVar1 = createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<float,tcu::Vector<float,3>,tcu::Vector<float,3>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                     (ctx,&local_38,
                      (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                       *)func_01);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vec4",&local_39);
  func_02 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Distance<4>>();
  pPVar1 = createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<float,tcu::Vector<float,4>,tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                     (ctx,&local_38,
                      (Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                       *)func_02);
  tcu::TestNode::addChild(this_00,(TestNode *)pPVar1);
  std::__cxx11::string::~string((string *)&local_38);
  (__return_storage_ptr__->super_UniqueBase<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>).
  m_data.ptr = this_00;
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase		(const Context& ctx) const
	{
		TestCaseGroup*	group = new TestCaseGroup(ctx.testContext,
							  ctx.name.c_str(), ctx.name.c_str());
		group->addChild(createFuncCase(ctx, "scalar", instance<GenF<1> >()));
		group->addChild(createFuncCase(ctx, "vec2", instance<GenF<2> >()));
		group->addChild(createFuncCase(ctx, "vec3", instance<GenF<3> >()));
		group->addChild(createFuncCase(ctx, "vec4", instance<GenF<4> >()));

		return MovePtr<TestNode>(group);
	}